

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
write_padded<duckdb_fmt::v6::internal::float_writer<char>>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>> *this,format_specs *specs,
          float_writer<char> *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  char __tmp;
  ulong uVar7;
  buffer<char> *c;
  ulong uVar8;
  size_t size;
  char *it;
  char *pcVar9;
  size_t __len;
  size_t __n;
  
  uVar6 = (ulong)(uint)specs->width;
  uVar7 = f->size_;
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  __n = uVar6 - uVar7;
  if (uVar6 < uVar7 || __n == 0) {
    uVar7 = uVar7 + lVar3;
    if ((ulong)puVar2[3] < uVar7) {
      (**(code **)*puVar2)(puVar2,uVar7);
    }
    puVar2[2] = uVar7;
    pcVar9 = (char *)(lVar3 + puVar2[1]);
LAB_00d975c2:
    uVar7 = (ulong)(byte)(f->specs_).field_0x5;
    if (uVar7 != 0) {
      *pcVar9 = *(char *)((long)&basic_data<void>::signs + uVar7);
      pcVar9 = pcVar9 + 1;
    }
    float_writer<char>::prettify<char*>(f,pcVar9);
    return;
  }
  uVar8 = lVar3 + uVar6;
  if ((ulong)puVar2[3] < uVar8) {
    (**(code **)*puVar2)(puVar2,uVar8);
  }
  puVar2[2] = uVar8;
  it = (char *)(lVar3 + puVar2[1]);
  bVar1 = (specs->fill).data_[0];
  bVar4 = specs->field_0x9 & 0xf;
  if (bVar4 == 3) {
    uVar8 = __n >> 1;
    pcVar9 = it;
    if (1 < __n) {
      pcVar9 = it + uVar8;
      switchD_0105dc25::default(it,(uint)bVar1,uVar8);
    }
    uVar5 = (ulong)(byte)(f->specs_).field_0x5;
    if (uVar5 != 0) {
      *pcVar9 = *(char *)((long)&basic_data<void>::signs + uVar5);
      pcVar9 = pcVar9 + 1;
    }
    pcVar9 = float_writer<char>::prettify<char*>(f,pcVar9);
    if (uVar6 != uVar7) {
      __n = __n - uVar8;
LAB_00d97685:
      switchD_0105dc25::default(pcVar9,(uint)bVar1,__n);
      return;
    }
  }
  else {
    if (bVar4 == 2) {
      pcVar9 = it;
      if (uVar6 != uVar7) {
        pcVar9 = it + __n;
        switchD_0105dc25::default(it,(uint)bVar1,__n);
      }
      goto LAB_00d975c2;
    }
    uVar8 = (ulong)(byte)(f->specs_).field_0x5;
    if (uVar8 != 0) {
      *it = *(char *)((long)&basic_data<void>::signs + uVar8);
      it = it + 1;
    }
    pcVar9 = float_writer<char>::prettify<char*>(f,it);
    if (uVar6 != uVar7) goto LAB_00d97685;
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }